

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O2

void printArithExtend(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  MCOperand *pMVar6;
  ulong uVar7;
  char *pcVar8;
  AArch64_AM_ShiftExtendType ST;
  byte bVar9;
  
  pMVar6 = MCInst_getOperand(MI,OpNum);
  uVar7 = MCOperand_getImm(pMVar6);
  switch((uint)(uVar7 >> 3) & 7) {
  case 0:
    ST = AArch64_AM_UXTB;
    break;
  case 1:
    ST = AArch64_AM_UXTH;
    break;
  case 2:
    ST = AArch64_AM_UXTW;
    bVar9 = 1;
    bVar3 = false;
    goto LAB_00183bc2;
  case 3:
    ST = AArch64_AM_UXTX;
    bVar3 = true;
    bVar9 = 0;
LAB_00183bc2:
    pMVar6 = MCInst_getOperand(MI,0);
    uVar4 = MCOperand_getReg(pMVar6);
    pMVar6 = MCInst_getOperand(MI,1);
    uVar5 = MCOperand_getReg(pMVar6);
    if (((!bVar3) || (uVar4 != 4 && uVar5 != 4)) && (!(bool)(bVar9 & (uVar5 == 5 || uVar4 == 5))))
    break;
    if ((uVar7 & 7) == 0) {
      return;
    }
    pcVar8 = ", lsl ";
    goto LAB_00183c95;
  case 4:
    ST = AArch64_AM_SXTB;
    break;
  case 5:
    ST = AArch64_AM_SXTH;
    break;
  case 6:
    ST = AArch64_AM_SXTW;
    break;
  case 7:
    ST = AArch64_AM_SXTX;
  }
  pcVar8 = AArch64_AM_getShiftExtendName(ST);
  SStream_concat(O,", %s",pcVar8);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + -6;
    puVar1[0] = '\x03';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
  }
  if ((uVar7 & 7) != 0) {
    pcVar8 = " ";
LAB_00183c95:
    uVar4 = (uint)uVar7 & 7;
    SStream_concat0(O,pcVar8);
    printInt32Bang(O,uVar4);
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->regs_write + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 7;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      pcVar2 = MI->flat_insn->detail;
      *(uint *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + -10) = uVar4;
    }
  }
  return;
}

Assistant:

static void printArithExtend(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned Val = (unsigned)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	AArch64_AM_ShiftExtendType ExtType = AArch64_AM_getArithExtendType(Val);
	unsigned ShiftVal = AArch64_AM_getArithShiftValue(Val);

	// If the destination or first source register operand is [W]SP, print
	// UXTW/UXTX as LSL, and if the shift amount is also zero, print nothing at
	// all.
	if (ExtType == AArch64_AM_UXTW || ExtType == AArch64_AM_UXTX) {
		unsigned Dest = MCOperand_getReg(MCInst_getOperand(MI, 0));
		unsigned Src1 = MCOperand_getReg(MCInst_getOperand(MI, 1));
		if ( ((Dest == AArch64_SP || Src1 == AArch64_SP) &&
					ExtType == AArch64_AM_UXTX) ||
				((Dest == AArch64_WSP || Src1 == AArch64_WSP) &&
				 ExtType == AArch64_AM_UXTW) ) {
			if (ShiftVal != 0) {
				SStream_concat0(O, ", lsl ");
				printInt32Bang(O, ShiftVal);
				if (MI->csh->detail) {
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].shift.type = ARM64_SFT_LSL;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].shift.value = ShiftVal;
				}
			}

			return;
		}
	}

	SStream_concat(O, ", %s", AArch64_AM_getShiftExtendName(ExtType));
	if (MI->csh->detail) {
		arm64_extender ext = ARM64_EXT_INVALID;
		switch(ExtType) {
			default:	// never reach
			case AArch64_AM_UXTB:
				ext = ARM64_EXT_UXTW;
				break;
			case AArch64_AM_UXTH:
				ext = ARM64_EXT_UXTW;
				break;
			case AArch64_AM_UXTW:
				ext = ARM64_EXT_UXTW;
				break;
			case AArch64_AM_UXTX:
				ext = ARM64_EXT_UXTW;
				break;
			case AArch64_AM_SXTB:
				ext = ARM64_EXT_UXTW;
				break;
			case AArch64_AM_SXTH:
				ext = ARM64_EXT_UXTW;
				break;
			case AArch64_AM_SXTW:
				ext = ARM64_EXT_UXTW;
				break;
			case AArch64_AM_SXTX:
				ext = ARM64_EXT_UXTW;
				break;
		}

		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].ext = ext;
	}

	if (ShiftVal != 0) {
		SStream_concat0(O, " ");
		printInt32Bang(O, ShiftVal);
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].shift.type = ARM64_SFT_LSL;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].shift.value = ShiftVal;
		}
	}
}